

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.h
# Opt level: O0

void __thiscall
Js::JavascriptProxy::
GetOwnPropertyKeysHelper<Js::JavascriptProxy::PropertyKeysTrap(Js::JavascriptProxy::KeysTrapKind,Js::ScriptContext*)::__2>
          (JavascriptProxy *this,RecyclableObject *scriptContext,RecyclableObject *trapResultArray,
          uint len,BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *trapResult,Var targetToTrapResultMap)

{
  uint32 itemIndex;
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  bool local_5d;
  uint local_5c;
  PropertyId local_58;
  uint32 i;
  PropertyId propertyId;
  uint32 trapResultIndex;
  PropertyRecord *propertyRecord;
  Var element;
  BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *targetToTrapResultMap_local;
  JavascriptArray *trapResult_local;
  RecyclableObject *pRStack_28;
  uint32 len_local;
  RecyclableObject *trapResultArray_local;
  ScriptContext *scriptContext_local;
  JavascriptProxy *this_local;
  
  propertyRecord = (PropertyRecord *)0x0;
  i = 0;
  local_5c = 0;
  element = targetToTrapResultMap;
  targetToTrapResultMap_local = trapResult;
  trapResult_local._4_4_ = len;
  pRStack_28 = trapResultArray;
  trapResultArray_local = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  while( true ) {
    if (trapResult_local._4_4_ <= local_5c) {
      return;
    }
    BVar2 = Js::JavascriptOperators::GetItem
                      (pRStack_28,local_5c,&propertyRecord,(ScriptContext *)trapResultArray_local);
    if ((BVar2 == 0) ||
       ((bVar1 = VarIs<Js::JavascriptString>(propertyRecord), !bVar1 &&
        (bVar1 = VarIs<Js::JavascriptSymbol>(propertyRecord), !bVar1)))) break;
    JavascriptConversion::ToPropertyKey
              (propertyRecord,(ScriptContext *)trapResultArray_local,(PropertyRecord **)&propertyId,
               (PropertyString **)0x0);
    local_58 = PropertyRecord::GetPropertyId(_propertyId);
    if (local_58 != -1) {
      local_5d = true;
      iVar3 = JsUtil::
              BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::AddNew((BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)element,&local_58,&local_5d);
      if (iVar3 == -1) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)trapResultArray_local,-0x7ff5e9d2,(PCWSTR)0x0);
      }
    }
    bVar1 = PropertyKeysTrap::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&this_local + 7),_propertyId);
    itemIndex = i;
    if (bVar1) {
      i = i + 1;
      Js::JavascriptArray::DirectSetItemAt<void*>
                ((JavascriptArray *)targetToTrapResultMap_local,itemIndex,propertyRecord);
    }
    local_5c = local_5c + 1;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)trapResultArray_local,-0x7ff5ea14,L"ownKeys");
}

Assistant:

void GetOwnPropertyKeysHelper(ScriptContext* scriptContext, RecyclableObject* trapResultArray, uint32 len, JavascriptArray* trapResult,
            JsUtil::BaseDictionary<Js::PropertyId, bool, ArenaAllocator>& targetToTrapResultMap, Fn fn)
        {
            Var element = nullptr;
            const PropertyRecord* propertyRecord;
            uint32 trapResultIndex = 0;
            PropertyId propertyId;
            for (uint32 i = 0; i < len; i++)
            {
                if (!JavascriptOperators::GetItem(trapResultArray, i, &element, scriptContext) || // missing
                    !(VarIs<JavascriptString>(element) || VarIs<JavascriptSymbol>(element)))  // neither String nor Symbol
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_InconsistentTrapResult, _u("ownKeys"));
                }

                JavascriptConversion::ToPropertyKey(element, scriptContext, &propertyRecord, nullptr);
                propertyId = propertyRecord->GetPropertyId();

                if (propertyId != Constants::NoProperty)
                {
                    if (targetToTrapResultMap.AddNew(propertyId, true) == -1)
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_DuplicateKeysFromOwnPropertyKeys);
                    }
                }

                if (fn(propertyRecord))
                {
                    trapResult->DirectSetItemAt(trapResultIndex++, element);
                }
            }
        }